

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::parse_objects_color_hex_code(Parser *this)

{
  int iVar1;
  string color_hex_code_str;
  Token<ParsedGame::ObjectsTokenType> color_hex_code;
  string local_90 [32];
  string local_70;
  undefined1 local_50 [40];
  int local_28;
  
  parse_word_abi_cxx11_(&local_70,this);
  std::__cxx11::string::string(local_90,(string *)&local_70);
  iVar1 = this->m_line_counter;
  local_50._0_4_ = ColorHexCode;
  std::__cxx11::string::string((string *)(local_50 + 8),local_90);
  local_28 = iVar1;
  std::__cxx11::string::~string(local_90);
  std::
  vector<Token<ParsedGame::ObjectsTokenType>,_std::allocator<Token<ParsedGame::ObjectsTokenType>_>_>
  ::push_back(&(this->m_parsed_game).objects_tokens,(value_type *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void Parser::parse_objects_color_hex_code()
{
	//todo make a more robust parse function and detect incorrect hex codes
	string color_hex_code_str = parse_word();
	Token<ParsedGame::ObjectsTokenType> color_hex_code(ParsedGame::ObjectsTokenType::ColorHexCode, color_hex_code_str, m_line_counter);
	m_parsed_game.objects_tokens.push_back(color_hex_code);
}